

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall CVmObjBigNum::neg_val(CVmObjBigNum *this,vm_val_t *result,vm_obj_id_t self)

{
  byte *pbVar1;
  ushort *puVar2;
  void *__dest;
  vm_datatype_t *pvVar3;
  ushort uVar4;
  vm_val_t *pvVar5;
  vm_obj_id_t vVar6;
  size_t digits;
  
  pvVar5 = sp_;
  puVar2 = (ushort *)(this->super_CVmObject).ext_;
  uVar4 = puVar2[2];
  if (((uVar4 & 2) == 0) && ((uVar4 & 8) == 0)) {
    uVar4 = *puVar2;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar5->val).obj = self;
    digits = 1;
    if (((this->super_CVmObject).ext_[4] & 6U) != 4) {
      digits = (ulong)uVar4;
    }
    vVar6 = create(0,digits);
    result->typ = VM_OBJ;
    (result->val).obj = vVar6;
    __dest = *(void **)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8);
    memcpy(__dest,(this->super_CVmObject).ext_,(ulong)((int)digits + 1U >> 1) + 5);
    pbVar1 = (byte *)((long)__dest + 4);
    *pbVar1 = *pbVar1 ^ 1;
    sp_ = sp_ + -1;
  }
  else {
    result->typ = VM_OBJ;
    (result->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::neg_val(VMG_ vm_val_t *result, vm_obj_id_t self)
{
    char *new_ext;
    size_t prec = get_prec(ext_);

    /* 
     *   If I'm not an ordinary number or an infinity, return myself
     *   unchanged.  Note that we change sign for an infinity, even though
     *   this might not make a great deal of sense mathematically.
     *   
     *   If I'm zero, likewise return myself unchanged.  Negative zero is
     *   still zero.  
     */
    if ((get_type(ext_) != VMBN_T_NUM && get_type(ext_) != VMBN_T_INF)
        || is_zero(ext_))
    {
        /* return myself unchanged */
        result->set_obj(self);
        return TRUE;
    }

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* if I'm an infinity, we don't need any precision in the result */
    if (is_infinity(ext_))
        prec = 1;

    /* create a new number with the same precision as the original */
    result->set_obj(create(vmg_ FALSE, prec));
    new_ext = get_objid_ext(vmg_ result->val.obj);

    /* make a copy in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* reverse the sign */
    set_neg(new_ext, !get_neg(new_ext));

    /* remove my self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}